

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_size
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  pos_type *ppVar1;
  fpos<__mbstate_t> args_3;
  fpos<__mbstate_t> args_5;
  streamoff sVar2;
  streamoff sVar3;
  undefined1 auVar4 [16];
  path local_a8;
  ulong local_80;
  streamoff size_bytes;
  streamoff local_68;
  __mbstate_t _Stack_60;
  streamoff local_58;
  streamoff sStack_50;
  path local_48;
  undefined1 auStack_20 [8];
  pos_type data_end;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  
  data_end._M_state = (__mbstate_t)this;
  std::istream::seekg((long)&this->stream_,_S_beg);
  check_stream(this,"seekg to end for size");
  auVar4 = std::istream::tellg();
  data_end._M_off = auVar4._8_8_;
  auStack_20 = auVar4._0_8_;
  sVar2 = std::fpos::operator_cast_to_long((fpos *)auStack_20);
  sVar3 = std::fpos::operator_cast_to_long((fpos *)&this->data_begin_);
  if (sVar2 < sVar3) {
    std::filesystem::__cxx11::path::path(&local_48,&this->filename_);
    local_58 = (streamoff)auStack_20;
    sStack_50 = data_end._M_off;
    ppVar1 = &this->data_begin_;
    local_68 = ppVar1->_M_off;
    _Stack_60 = (this->data_begin_)._M_state;
    args_5._M_off = ppVar1->_M_off;
    args_5._M_state = ppVar1->_M_state;
    args_3._M_state.__count = (undefined4)data_end._M_off;
    args_3._M_state.__value = (anon_union_4_2_91654ee9_for___value)data_end._M_off._4_4_;
    args_3._M_off = (streamoff)auStack_20;
    throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,std::fpos<__mbstate_t>,char_const*,std::fpos<__mbstate_t>>
              ("File with negative data size: ",&local_48,", data_end: ",args_3,", data_begin_: ",
               args_5);
  }
  local_80 = std::fpos<__mbstate_t>::operator-((fpos<__mbstate_t> *)auStack_20,&this->data_begin_);
  if (local_80 % 0x38 != 0) {
    std::filesystem::__cxx11::path::path(&local_a8,&this->filename_);
    throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,long,char_const*,unsigned_long>
              ("File with irregular data size: ",&local_a8,", size in bytes: ",local_80,
               ", value_size: ",0x38);
  }
  return;
}

Assistant:

void check_size()
    {
        stream_.seekg(0, std::fstream::end);
        check_stream("seekg to end for size");
        auto data_end = stream_.tellg();
        if (data_end < data_begin_)
        {
            throw_exception("File with negative data size: ", filename_, ", data_end: ", data_end,
                            ", data_begin_: ", data_begin_);
        }
        auto size_bytes = data_end - data_begin_;
        if (size_bytes % value_size != 0)
        {
            throw_exception("File with irregular data size: ", filename_,
                            ", size in bytes: ", size_bytes, ", value_size: ", value_size);
        }
    }